

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O3

void secp256k1_scalar_split_lambda(secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  secp256k1_scalar c1;
  uint64_t l [8];
  secp256k1_scalar c2;
  undefined1 local_b8 [16];
  ulong local_a8;
  uint64_t local_a0;
  undefined8 local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_50 [16];
  ulong local_40;
  uint64_t local_38;
  
  uVar40 = k->d[0];
  uVar42 = k->d[1];
  uVar43 = k->d[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar40;
  uVar44 = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),8);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar44;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar40;
  auVar2 = auVar2 * ZEXT816(0x3daa8a1471e8ca7f);
  uVar53 = SUB168(auVar2 + auVar35,8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar42;
  uVar45 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
  uVar39 = (ulong)CARRY8(SUB168(auVar2 + auVar35,0),SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0));
  uVar41 = uVar53 + uVar45;
  uVar54 = uVar41 + uVar39;
  uVar56 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar44,auVar2._0_8_)) +
           (ulong)(CARRY8(uVar53,uVar45) || CARRY8(uVar41,uVar39));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar40;
  uVar46 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),8);
  uVar39 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),0);
  uVar55 = uVar54 + uVar39;
  uVar39 = (ulong)CARRY8(uVar54,uVar39);
  uVar45 = uVar56 + uVar46;
  uVar57 = uVar45 + uVar39;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar42;
  uVar47 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar44 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),0);
  uVar41 = (ulong)CARRY8(uVar55,uVar44);
  uVar53 = uVar57 + uVar47;
  uVar58 = uVar53 + uVar41;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar43;
  uVar48 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),8);
  uVar44 = (ulong)CARRY8(uVar55 + uVar44,SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),0));
  uVar54 = uVar58 + uVar48;
  uVar55 = uVar54 + uVar44;
  uVar58 = (ulong)(CARRY8(uVar56,uVar46) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar57,uVar47) || CARRY8(uVar53,uVar41)) +
           (ulong)(CARRY8(uVar58,uVar48) || CARRY8(uVar54,uVar44));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar40;
  uVar48 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar40 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar44 = uVar55 + uVar40;
  uVar39 = (ulong)CARRY8(uVar55,uVar40);
  uVar53 = uVar58 + uVar48;
  uVar49 = uVar53 + uVar39;
  uVar40 = k->d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar42;
  uVar55 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),8);
  uVar41 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),0);
  uVar47 = uVar44 + uVar41;
  uVar41 = (ulong)CARRY8(uVar44,uVar41);
  uVar54 = uVar49 + uVar55;
  uVar50 = uVar54 + uVar41;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar43;
  uVar56 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar45 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),0);
  uVar44 = (ulong)CARRY8(uVar47,uVar45);
  uVar46 = uVar50 + uVar56;
  uVar51 = uVar46 + uVar44;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar40;
  uVar57 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),8);
  uVar45 = (ulong)CARRY8(uVar47 + uVar45,SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),0));
  uVar47 = uVar51 + uVar57;
  uVar52 = uVar47 + uVar45;
  uVar48 = (ulong)(CARRY8(uVar58,uVar48) || CARRY8(uVar53,uVar39)) +
           (ulong)(CARRY8(uVar49,uVar55) || CARRY8(uVar54,uVar41)) +
           (ulong)(CARRY8(uVar50,uVar56) || CARRY8(uVar46,uVar44)) +
           (ulong)(CARRY8(uVar51,uVar57) || CARRY8(uVar47,uVar45));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar42;
  uVar54 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar42 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar53 = uVar52 + uVar42;
  uVar42 = (ulong)CARRY8(uVar52,uVar42);
  uVar44 = uVar48 + uVar54;
  uVar55 = uVar44 + uVar42;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar43;
  uVar46 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),8);
  uVar41 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),0);
  uVar39 = (ulong)CARRY8(uVar53,uVar41);
  uVar45 = uVar55 + uVar46;
  uVar56 = uVar45 + uVar39;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar40;
  uVar47 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar41 = (ulong)CARRY8(uVar53 + uVar41,SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),0));
  uVar53 = uVar56 + uVar47;
  uVar57 = uVar53 + uVar41;
  uVar46 = (ulong)(CARRY8(uVar48,uVar54) || CARRY8(uVar44,uVar42)) +
           (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar53,uVar41));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar43;
  uVar45 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar42 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar54 = uVar57 + uVar42;
  uVar42 = (ulong)CARRY8(uVar57,uVar42);
  uVar39 = uVar46 + uVar45;
  uVar47 = uVar39 + uVar42;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar40;
  uVar53 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),8);
  uVar44 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),0);
  uVar43 = (ulong)CARRY8(uVar54,uVar44);
  uVar41 = uVar47 + uVar53;
  auVar33._8_8_ =
       (ulong)(CARRY8(uVar46,uVar45) || CARRY8(uVar39,uVar42)) +
       (ulong)(CARRY8(uVar47,uVar53) || CARRY8(uVar41,uVar43));
  auVar33._0_8_ = uVar41 + uVar43;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar40;
  auVar33 = auVar16 * ZEXT816(0x3086d221a7d46bcd) + auVar33;
  local_68._8_8_ = auVar33._8_8_;
  uVar40 = CONCAT44(0,(uint)((long)(uVar54 + uVar44) >> 0x3f) >> 8 & 1);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar40;
  local_68._0_8_ = auVar33._0_8_;
  local_b8 = auVar33 + auVar37;
  local_a8 = (ulong)CARRY8(local_68._8_8_,(ulong)CARRY8(uVar40,local_68._0_8_));
  local_a0 = 0;
  uVar40 = k->d[0];
  uVar42 = k->d[1];
  uVar43 = k->d[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar40;
  uVar44 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),8);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar44;
  local_98 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar40;
  auVar18 = auVar18 * ZEXT816(0x221208ac9df506c6);
  uVar41 = SUB168(auVar18 + auVar36,0);
  uVar53 = SUB168(auVar18 + auVar36,8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar42;
  uVar45 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar39 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_90 = uVar41 + uVar39;
  uVar39 = (ulong)CARRY8(uVar41,uVar39);
  uVar41 = uVar53 + uVar45;
  uVar54 = uVar41 + uVar39;
  uVar55 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar44,auVar18._0_8_)) +
           (ulong)(CARRY8(uVar53,uVar45) || CARRY8(uVar41,uVar39));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar40;
  uVar46 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar39 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar44 = uVar54 + uVar39;
  uVar39 = (ulong)CARRY8(uVar54,uVar39);
  uVar45 = uVar55 + uVar46;
  uVar56 = uVar45 + uVar39;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar42;
  uVar47 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),8);
  uVar41 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),0);
  uVar54 = uVar44 + uVar41;
  uVar41 = (ulong)CARRY8(uVar44,uVar41);
  uVar53 = uVar56 + uVar47;
  uVar57 = uVar53 + uVar41;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar43;
  uVar48 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar44 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_88 = uVar54 + uVar44;
  uVar44 = (ulong)CARRY8(uVar54,uVar44);
  uVar54 = uVar57 + uVar48;
  uVar49 = uVar54 + uVar44;
  uVar58 = (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar53,uVar41)) +
           (ulong)(CARRY8(uVar57,uVar48) || CARRY8(uVar54,uVar44));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar40;
  uVar48 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),8);
  uVar40 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),0);
  uVar44 = uVar49 + uVar40;
  uVar39 = (ulong)CARRY8(uVar49,uVar40);
  uVar53 = uVar58 + uVar48;
  uVar49 = uVar53 + uVar39;
  uVar40 = k->d[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar42;
  uVar55 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar41 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar45 = uVar44 + uVar41;
  uVar41 = (ulong)CARRY8(uVar44,uVar41);
  uVar54 = uVar49 + uVar55;
  uVar50 = uVar54 + uVar41;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar43;
  uVar56 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),8);
  uVar44 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),0);
  uVar47 = uVar45 + uVar44;
  uVar44 = (ulong)CARRY8(uVar45,uVar44);
  uVar46 = uVar50 + uVar56;
  uVar51 = uVar46 + uVar44;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar40;
  uVar57 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar45 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_80 = uVar47 + uVar45;
  uVar45 = (ulong)CARRY8(uVar47,uVar45);
  uVar47 = uVar51 + uVar57;
  uVar52 = uVar47 + uVar45;
  uVar48 = (ulong)(CARRY8(uVar58,uVar48) || CARRY8(uVar53,uVar39)) +
           (ulong)(CARRY8(uVar49,uVar55) || CARRY8(uVar54,uVar41)) +
           (ulong)(CARRY8(uVar50,uVar56) || CARRY8(uVar46,uVar44)) +
           (ulong)(CARRY8(uVar51,uVar57) || CARRY8(uVar47,uVar45));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar42;
  uVar54 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),8);
  uVar42 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),0);
  uVar41 = uVar52 + uVar42;
  uVar42 = (ulong)CARRY8(uVar52,uVar42);
  uVar44 = uVar48 + uVar54;
  uVar55 = uVar44 + uVar42;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar43;
  uVar46 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar39 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar53 = uVar41 + uVar39;
  uVar39 = (ulong)CARRY8(uVar41,uVar39);
  uVar45 = uVar55 + uVar46;
  uVar56 = uVar45 + uVar39;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar40;
  uVar47 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),8);
  uVar41 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),0);
  local_78 = uVar53 + uVar41;
  uVar41 = (ulong)CARRY8(uVar53,uVar41);
  uVar53 = uVar56 + uVar47;
  uVar57 = uVar53 + uVar41;
  uVar53 = (ulong)(CARRY8(uVar48,uVar54) || CARRY8(uVar44,uVar42)) +
           (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar45,uVar39)) +
           (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar53,uVar41));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar43;
  uVar44 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),8);
  uVar42 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),0);
  uVar41 = uVar57 + uVar42;
  uVar42 = (ulong)CARRY8(uVar57,uVar42);
  uVar39 = uVar53 + uVar44;
  uVar54 = uVar39 + uVar42;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar40;
  uVar45 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar43 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),0);
  local_70 = uVar41 + uVar43;
  uVar43 = (ulong)CARRY8(uVar41,uVar43);
  uVar41 = uVar54 + uVar45;
  auVar34._8_8_ =
       (ulong)(CARRY8(uVar53,uVar44) || CARRY8(uVar39,uVar42)) +
       (ulong)(CARRY8(uVar54,uVar45) || CARRY8(uVar41,uVar43));
  auVar34._0_8_ = uVar41 + uVar43;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar40;
  local_68 = auVar32 * ZEXT816(0xe4437ed6010e8828) + auVar34;
  uVar40 = CONCAT44(0,(uint)(local_70 >> 0x3f) >> 8 & 1);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar40;
  local_50 = local_68 + auVar38;
  local_40 = (ulong)CARRY8(local_68._8_8_,(ulong)CARRY8(uVar40,local_68._0_8_));
  local_38 = 0;
  secp256k1_scalar_mul
            ((secp256k1_scalar *)local_b8,(secp256k1_scalar *)local_b8,
             &secp256k1_scalar_split_lambda::minus_b1);
  secp256k1_scalar_mul
            ((secp256k1_scalar *)local_50,(secp256k1_scalar *)local_50,
             &secp256k1_scalar_split_lambda::minus_b2);
  secp256k1_scalar_add(r2,(secp256k1_scalar *)local_b8,(secp256k1_scalar *)local_50);
  secp256k1_scalar_mul(r1,r2,&secp256k1_const_lambda);
  secp256k1_scalar_negate(r1,r1);
  secp256k1_scalar_add(r1,r1,k);
  return;
}

Assistant:

static void secp256k1_scalar_split_lambda(secp256k1_scalar *r1, secp256k1_scalar *r2, const secp256k1_scalar *k) {
    secp256k1_scalar c1, c2;
    static const secp256k1_scalar minus_b1 = SECP256K1_SCALAR_CONST(
        0x00000000UL, 0x00000000UL, 0x00000000UL, 0x00000000UL,
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C3UL
    );
    static const secp256k1_scalar minus_b2 = SECP256K1_SCALAR_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFEUL,
        0x8A280AC5UL, 0x0774346DUL, 0xD765CDA8UL, 0x3DB1562CUL
    );
    static const secp256k1_scalar g1 = SECP256K1_SCALAR_CONST(
        0x3086D221UL, 0xA7D46BCDUL, 0xE86C90E4UL, 0x9284EB15UL,
        0x3DAA8A14UL, 0x71E8CA7FUL, 0xE893209AUL, 0x45DBB031UL
    );
    static const secp256k1_scalar g2 = SECP256K1_SCALAR_CONST(
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C4UL,
        0x221208ACUL, 0x9DF506C6UL, 0x1571B4AEUL, 0x8AC47F71UL
    );
    VERIFY_CHECK(r1 != k);
    VERIFY_CHECK(r2 != k);
    /* these _var calls are constant time since the shift amount is constant */
    secp256k1_scalar_mul_shift_var(&c1, k, &g1, 384);
    secp256k1_scalar_mul_shift_var(&c2, k, &g2, 384);
    secp256k1_scalar_mul(&c1, &c1, &minus_b1);
    secp256k1_scalar_mul(&c2, &c2, &minus_b2);
    secp256k1_scalar_add(r2, &c1, &c2);
    secp256k1_scalar_mul(r1, r2, &secp256k1_const_lambda);
    secp256k1_scalar_negate(r1, r1);
    secp256k1_scalar_add(r1, r1, k);

#ifdef VERIFY
    secp256k1_scalar_split_lambda_verify(r1, r2, k);
#endif
}